

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederate.cpp
# Opt level: O2

void __thiscall
helics::ValueFederate::publishBytes(ValueFederate *this,Publication *pub,data_view *block)

{
  InvalidFunctionCall *this_00;
  string_view message;
  
  if ((this->_vptr_ValueFederate[-3][(long)&(this->vfManager)._M_t] != (_func_int)0x2) &&
     (this->_vptr_ValueFederate[-3][(long)&(this->vfManager)._M_t] != (_func_int)0x1)) {
    this_00 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "publications not allowed outside of execution and initialization state";
    message._M_len = 0x46;
    InvalidFunctionCall::InvalidFunctionCall(this_00,message);
    __cxa_throw(this_00,&InvalidFunctionCall::typeinfo,HelicsException::~HelicsException);
  }
  ValueFederateManager::publish
            ((this->vfManager)._M_t.
             super___uniq_ptr_impl<helics::ValueFederateManager,_std::default_delete<helics::ValueFederateManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::ValueFederateManager_*,_std::default_delete<helics::ValueFederateManager>_>
             .super__Head_base<0UL,_helics::ValueFederateManager_*,_false>._M_head_impl,pub,block);
  return;
}

Assistant:

void ValueFederate::publishBytes(const Publication& pub, data_view block)  // NOLINT
{
    if ((currentMode == Modes::EXECUTING) || (currentMode == Modes::INITIALIZING)) {
        vfManager->publish(pub, block);
    } else {
        throw(InvalidFunctionCall(
            "publications not allowed outside of execution and initialization state"));
    }
}